

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::XercesStep> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  RefVectorOf<xercesc_4_0::XercesStep> *this;
  XSerializeEngine *manager_00;
  XercesStep *toAdd;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  XMLSize_t maxElems;
  XMLSize_t i;
  ulong uVar2;
  XMLSize_t vectorLength;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (RefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      this = (RefVectorOf<xercesc_4_0::XercesStep> *)XMemory::operator_new(0x30,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      maxElems = 0x10;
      if (-1 < initSize) {
        maxElems = (XMLSize_t)(uint)initSize;
      }
      RefVectorOf<xercesc_4_0::XercesStep>::RefVectorOf
                (this,maxElems,toAdopt,(MemoryManager *)manager_00);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    vectorLength = 0;
    XSerializeEngine::readSize(serEng,&vectorLength);
    __buf = extraout_RDX;
    for (uVar2 = 0; uVar2 < vectorLength; uVar2 = uVar2 + 1) {
      toAdd = (XercesStep *)XSerializeEngine::read(serEng,0x434438,__buf,(size_t)manager_00);
      BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                (&(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,toAdd);
      __buf = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<XercesStep>** objToLoad
                                   , int                       initSize
                                   , bool                      toAdopt
                                   , XSerializeEngine&         serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<XercesStep>(
                                                     initSize
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                    );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            XercesStep*  data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}